

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseTree.cpp
# Opt level: O2

SynReturn * ParseReturn(ParseContext *ctx)

{
  Lexeme *begin;
  int iVar1;
  SynBase *value;
  undefined4 extraout_var;
  Lexeme *end;
  SynReturn *this;
  
  begin = ctx->currentLexeme;
  if (begin->type == lex_return) {
    ctx->currentLexeme = begin + 1;
    value = ParseAssignment(ctx);
    anon_unknown.dwarf_1519a::CheckConsume
              (ctx,lex_semicolon,
               "ERROR: return statement must be followed by an expression or \';\'");
    iVar1 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x48);
    this = (SynReturn *)CONCAT44(extraout_var,iVar1);
    end = ParseContext::Previous(ctx);
    SynReturn::SynReturn(this,begin,end,value);
  }
  else {
    this = (SynReturn *)0x0;
  }
  return this;
}

Assistant:

SynReturn* ParseReturn(ParseContext &ctx)
{
	Lexeme *start = ctx.currentLexeme;

	if(ctx.Consume(lex_return))
	{
		// Optional
		SynBase *value = ParseAssignment(ctx);

		CheckConsume(ctx, lex_semicolon, "ERROR: return statement must be followed by an expression or ';'");

		return new (ctx.get<SynReturn>()) SynReturn(start, ctx.Previous(), value);
	}

	return NULL;
}